

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

int Ssw_ManGetSatVarValue(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Ssw_Sat_t *p_00;
  int v;
  uint uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_00;
  uint local_44;
  uint local_2c;
  int nVarNum;
  int Value;
  Aig_Obj_t *pObjFraig;
  int fUseNoBoundary;
  int f_local;
  Aig_Obj_t *pObj_local;
  Ssw_Man_t *p_local;
  
  pAVar2 = Ssw_ObjFrame(p,pObj,f);
  p_00 = p->pMSat;
  pObj_00 = Aig_Regular(pAVar2);
  v = Ssw_ObjSatNum(p_00,pObj_00);
  if (v == 0) {
    local_44 = 0;
  }
  else {
    local_44 = Aig_IsComplement(pAVar2);
    uVar1 = sat_solver_var_value(p->pMSat->pSat,v);
    local_44 = local_44 ^ uVar1;
  }
  local_2c = local_44;
  if ((p->pPars->fPolarFlip != 0) &&
     (pAVar2 = Aig_Regular(pAVar2), (*(ulong *)&pAVar2->field_0x18 >> 3 & 1) != 0)) {
    local_2c = local_44 ^ 1;
  }
  return local_2c;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Retrives value of the PI in the original AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Ssw_ManGetSatVarValue( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    int fUseNoBoundary = 0;
    Aig_Obj_t * pObjFraig;
    int Value;
//    assert( Aig_ObjIsCi(pObj) );
    pObjFraig = Ssw_ObjFrame( p, pObj, f );
    if ( fUseNoBoundary )
    {
        Value = Ssw_CnfGetNodeValue( p->pMSat, Aig_Regular(pObjFraig) );
        Value ^= Aig_IsComplement(pObjFraig);
    }
    else
    {
        int nVarNum = Ssw_ObjSatNum( p->pMSat, Aig_Regular(pObjFraig) );
        Value = (!nVarNum)? 0 : (Aig_IsComplement(pObjFraig) ^ sat_solver_var_value( p->pMSat->pSat, nVarNum ));
    }

//    Value = (Aig_IsComplement(pObjFraig) ^ ((!nVarNum)? 0 : sat_solver_var_value( p->pSat, nVarNum )));
//    Value = (!nVarNum)? Aig_ManRandom(0) & 1 : (Aig_IsComplement(pObjFraig) ^ sat_solver_var_value( p->pSat, nVarNum ));
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_Regular(pObjFraig)->fPhase )  Value ^= 1;
    }
    return Value;
}